

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicSSOCase2::Cleanup(BasicSSOCase2 *this)

{
  BasicSSOCase2 *this_local;
  
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program_ab);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program_c);
  glu::CallLogWrapper::glDeleteProgramPipelines
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&this->m_pipeline);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&this->m_storage_buffer);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&this->m_vao);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteProgram(m_program_ab);
		glDeleteProgram(m_program_c);
		glDeleteProgramPipelines(1, &m_pipeline);
		glDeleteBuffers(1, &m_storage_buffer);
		glDeleteVertexArrays(1, &m_vao);
		return NO_ERROR;
	}